

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O3

unsigned_long
AdaptingProcess(PaUtilBufferProcessor *bp,int *streamCallbackResult,int processPartialUserBuffers)

{
  void ***pppvVar1;
  void ***pppvVar2;
  uint uVar3;
  void **ppvVar4;
  unsigned_long uVar5;
  PaStreamCallbackTimeInfo *pPVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  void ***pppvVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  void *pvVar20;
  ulong uVar21;
  PaUtilChannelDescriptor *pPVar22;
  undefined1 auVar23 [16];
  double dVar24;
  unsigned_long local_70;
  ulong local_68;
  
  local_68 = bp->hostInputFrameCount[1] + bp->hostInputFrameCount[0];
  if (processPartialUserBuffers == 0) {
    uVar14 = bp->framesPerUserBuffer - 1;
  }
  else {
    uVar14 = 0;
  }
  CopyTempOutputBuffersToHostOutputBuffers(bp);
  if (uVar14 < local_68) {
    pppvVar1 = &bp->tempInputBufferPtrs;
    pppvVar2 = &bp->tempOutputBufferPtrs;
    local_70 = 0;
    do {
      if ((bp->framesInTempOutputBuffer == 0) && (*streamCallbackResult != 0)) {
        lVar19 = 0;
        bVar7 = true;
        do {
          bVar15 = bVar7;
          uVar3 = (uint)bp->hostOutputFrameCount[lVar19];
          if (uVar3 != 0) {
            if (bp->outputChannelCount != 0) {
              pPVar22 = bp->hostOutputChannels[lVar19];
              uVar18 = 0;
              do {
                (*bp->outputZeroer)(pPVar22->data,pPVar22->stride,uVar3);
                pPVar22->data =
                     (void *)((long)pPVar22->data +
                             (ulong)(pPVar22->stride * uVar3 * bp->bytesPerHostOutputSample));
                uVar18 = uVar18 + 1;
                pPVar22 = pPVar22 + 1;
              } while (uVar18 < bp->outputChannelCount);
            }
            bp->hostOutputFrameCount[lVar19] = 0;
          }
          lVar19 = 1;
          bVar7 = false;
        } while (bVar15);
      }
      uVar18 = bp->framesPerUserBuffer;
      uVar21 = bp->framesInTempInputBuffer;
      if (uVar21 < uVar18) {
        uVar9 = bp->hostInputFrameCount[0];
        do {
          if (uVar9 + bp->hostInputFrameCount[1] == 0) break;
          uVar11 = bp->hostInputFrameCount[1];
          if (uVar9 != 0) {
            uVar11 = uVar9;
          }
          if (uVar18 - uVar21 <= uVar11) {
            uVar11 = uVar18 - uVar21;
          }
          uVar3 = bp->bytesPerUserInputSample;
          if (bp->userInputIsInterleaved == 0) {
            uVar10 = (int)uVar18 * uVar3;
            uVar17 = bp->inputChannelCount;
            uVar13 = 1;
            uVar16 = uVar3;
          }
          else {
            uVar17 = bp->inputChannelCount;
            uVar16 = uVar17 * uVar3;
            uVar13 = uVar17;
            uVar10 = uVar3;
          }
          if (uVar17 != 0) {
            pPVar22 = bp->hostInputChannels[uVar9 == 0];
            pvVar20 = (void *)(uVar21 * uVar16 + (long)bp->tempInputBuffer);
            uVar18 = 0;
            do {
              (*bp->inputConverter)
                        (pvVar20,uVar13,pPVar22->data,pPVar22->stride,(uint)uVar11,
                         &bp->ditherGenerator);
              pvVar20 = (void *)((long)pvVar20 + (ulong)uVar10);
              pPVar22->data =
                   (void *)((long)pPVar22->data +
                           (ulong)(pPVar22->stride * (uint)uVar11 * bp->bytesPerHostInputSample));
              uVar18 = uVar18 + 1;
              pPVar22 = pPVar22 + 1;
            } while (uVar18 < bp->inputChannelCount);
            uVar9 = bp->hostInputFrameCount[0];
          }
          uVar11 = uVar11 & 0xffffffff;
          if (uVar9 == 0) {
            bp->hostInputFrameCount[1] = bp->hostInputFrameCount[1] - uVar11;
            uVar9 = 0;
          }
          else {
            uVar9 = uVar9 - uVar11;
            bp->hostInputFrameCount[0] = uVar9;
          }
          uVar21 = bp->framesInTempInputBuffer + uVar11;
          bp->framesInTempInputBuffer = uVar21;
          local_68 = local_68 - uVar11;
          local_70 = local_70 + uVar11;
          uVar18 = bp->framesPerUserBuffer;
        } while (uVar21 < uVar18);
      }
      if ((uVar21 == uVar18) && (bp->framesInTempOutputBuffer == 0)) {
        if (*streamCallbackResult == 0) {
          pppvVar12 = (void ***)&bp->tempInputBuffer;
          if ((bp->userInputIsInterleaved == 0) &&
             (uVar3 = bp->inputChannelCount, pppvVar12 = pppvVar1, (ulong)uVar3 != 0)) {
            uVar17 = bp->bytesPerUserInputSample;
            lVar19 = 0;
            uVar18 = 0;
            do {
              (*pppvVar1)[uVar18] = (void *)((long)bp->tempInputBuffer + lVar19);
              uVar18 = uVar18 + 1;
              lVar19 = lVar19 + uVar17 * uVar21;
            } while (uVar3 != uVar18);
          }
          ppvVar4 = *pppvVar12;
          pppvVar12 = (void ***)&bp->tempOutputBuffer;
          if ((bp->userOutputIsInterleaved == 0) &&
             (uVar3 = bp->outputChannelCount, pppvVar12 = pppvVar2, (ulong)uVar3 != 0)) {
            uVar17 = bp->bytesPerUserOutputSample;
            lVar19 = 0;
            uVar18 = 0;
            do {
              (*pppvVar2)[uVar18] = (void *)((long)bp->tempOutputBuffer + lVar19);
              uVar18 = uVar18 + 1;
              lVar19 = lVar19 + uVar17 * uVar21;
            } while (uVar3 != uVar18);
          }
          iVar8 = (*bp->streamCallback)
                            (ppvVar4,*pppvVar12,uVar21,bp->timeInfo,bp->callbackStatusFlags,
                             bp->userData);
          *streamCallbackResult = iVar8;
          uVar5 = bp->framesPerUserBuffer;
          pPVar6 = bp->timeInfo;
          auVar23._8_4_ = (int)(uVar5 >> 0x20);
          auVar23._0_8_ = uVar5;
          auVar23._12_4_ = 0x45300000;
          dVar24 = ((auVar23._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) *
                   bp->samplePeriod;
          pPVar6->inputBufferAdcTime = pPVar6->inputBufferAdcTime + dVar24;
          pPVar6->outputBufferDacTime = dVar24 + pPVar6->outputBufferDacTime;
          bp->framesInTempInputBuffer = 0;
          if (iVar8 == 2) {
            bp->framesInTempOutputBuffer = 0;
          }
          else {
            bp->framesInTempOutputBuffer = uVar5;
          }
        }
        else {
          bp->framesInTempInputBuffer = 0;
        }
      }
      CopyTempOutputBuffersToHostOutputBuffers(bp);
    } while (uVar14 < local_68);
  }
  else {
    local_70 = 0;
  }
  return local_70;
}

Assistant:

static unsigned long AdaptingProcess( PaUtilBufferProcessor *bp,
        int *streamCallbackResult, int processPartialUserBuffers )
{
    void *userInput, *userOutput;
    unsigned long framesProcessed = 0;
    unsigned long framesAvailable;
    unsigned long endProcessingMinFrameCount;
    unsigned long maxFramesToCopy;
    PaUtilChannelDescriptor *hostInputChannels, *hostOutputChannels;
    unsigned int frameCount;
    unsigned char *destBytePtr;
    unsigned int destSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int destChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i, j;


    framesAvailable = bp->hostInputFrameCount[0] + bp->hostInputFrameCount[1];/* this is assumed to be the same as the output buffer's frame count */

    if( processPartialUserBuffers )
        endProcessingMinFrameCount = 0;
    else
        endProcessingMinFrameCount = (bp->framesPerUserBuffer - 1);

    /* Fill host output with remaining frames in user output (tempOutputBuffer) */
    CopyTempOutputBuffersToHostOutputBuffers( bp );

    while( framesAvailable > endProcessingMinFrameCount )
    {

        if( bp->framesInTempOutputBuffer == 0 && *streamCallbackResult != paContinue )
        {
            /* the callback will not be called any more, so zero what remains
                of the host output buffers */

            for( i=0; i<2; ++i )
            {
                frameCount = bp->hostOutputFrameCount[i];
                if( frameCount > 0 )
                {
                    hostOutputChannels = bp->hostOutputChannels[i];

                    for( j=0; j<bp->outputChannelCount; ++j )
                    {
                        bp->outputZeroer(   hostOutputChannels[j].data,
                                            hostOutputChannels[j].stride,
                                            frameCount );

                        /* advance dest ptr for next iteration  */
                        hostOutputChannels[j].data = ((unsigned char*)hostOutputChannels[j].data) +
                                frameCount * hostOutputChannels[j].stride * bp->bytesPerHostOutputSample;
                    }
                    bp->hostOutputFrameCount[i] = 0;
                }
            }
        }


        /* copy frames from host to user input buffers */
        while( bp->framesInTempInputBuffer < bp->framesPerUserBuffer &&
                ((bp->hostInputFrameCount[0] + bp->hostInputFrameCount[1]) > 0) )
        {
            maxFramesToCopy = bp->framesPerUserBuffer - bp->framesInTempInputBuffer;

            /* select the input buffer set (1st or 2nd) */
            if( bp->hostInputFrameCount[0] > 0 )
            {
                hostInputChannels = bp->hostInputChannels[0];
                frameCount = PA_MIN_( bp->hostInputFrameCount[0], maxFramesToCopy );
            }
            else
            {
                hostInputChannels = bp->hostInputChannels[1];
                frameCount = PA_MIN_( bp->hostInputFrameCount[1], maxFramesToCopy );
            }

            /* configure conversion destination pointers */
            if( bp->userInputIsInterleaved )
            {
                destBytePtr = ((unsigned char*)bp->tempInputBuffer) +
                        bp->bytesPerUserInputSample * bp->inputChannelCount *
                        bp->framesInTempInputBuffer;

                destSampleStrideSamples = bp->inputChannelCount;
                destChannelStrideBytes = bp->bytesPerUserInputSample;
            }
            else /* user input is not interleaved */
            {
                destBytePtr = ((unsigned char*)bp->tempInputBuffer) +
                        bp->bytesPerUserInputSample * bp->framesInTempInputBuffer;

                destSampleStrideSamples = 1;
                destChannelStrideBytes = bp->framesPerUserBuffer * bp->bytesPerUserInputSample;
            }

            for( i=0; i<bp->inputChannelCount; ++i )
            {
                bp->inputConverter( destBytePtr, destSampleStrideSamples,
                                        hostInputChannels[i].data,
                                        hostInputChannels[i].stride,
                                        frameCount, &bp->ditherGenerator );

                destBytePtr += destChannelStrideBytes;  /* skip to next destination channel */

                /* advance src ptr for next iteration */
                hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                        frameCount * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
            }

            if( bp->hostInputFrameCount[0] > 0 )
                bp->hostInputFrameCount[0] -= frameCount;
            else
                bp->hostInputFrameCount[1] -= frameCount;

            bp->framesInTempInputBuffer += frameCount;

            /* update framesAvailable and framesProcessed based on input consumed
                unless something is very wrong this will also correspond to the
                amount of output generated */
            framesAvailable -= frameCount;
            framesProcessed += frameCount;
        }

        /* call streamCallback */
        if( bp->framesInTempInputBuffer == bp->framesPerUserBuffer &&
            bp->framesInTempOutputBuffer == 0 )
        {
            if( *streamCallbackResult == paContinue )
            {
                /* setup userInput */
                if( bp->userInputIsInterleaved )
                {
                    userInput = bp->tempInputBuffer;
                }
                else /* user input is not interleaved */
                {
                    for( i = 0; i < bp->inputChannelCount; ++i )
                    {
                        bp->tempInputBufferPtrs[i] = ((unsigned char*)bp->tempInputBuffer) +
                                i * bp->framesPerUserBuffer * bp->bytesPerUserInputSample;
                    }

                    userInput = bp->tempInputBufferPtrs;
                }

                /* setup userOutput */
                if( bp->userOutputIsInterleaved )
                {
                    userOutput = bp->tempOutputBuffer;
                }
                else /* user output is not interleaved */
                {
                    for( i = 0; i < bp->outputChannelCount; ++i )
                    {
                        bp->tempOutputBufferPtrs[i] = ((unsigned char*)bp->tempOutputBuffer) +
                                i * bp->framesPerUserBuffer * bp->bytesPerUserOutputSample;
                    }

                    userOutput = bp->tempOutputBufferPtrs;
                }

                /* call streamCallback */

                *streamCallbackResult = bp->streamCallback( userInput, userOutput,
                        bp->framesPerUserBuffer, bp->timeInfo,
                        bp->callbackStatusFlags, bp->userData );

                bp->timeInfo->inputBufferAdcTime += bp->framesPerUserBuffer * bp->samplePeriod;
                bp->timeInfo->outputBufferDacTime += bp->framesPerUserBuffer * bp->samplePeriod;

                bp->framesInTempInputBuffer = 0;

                if( *streamCallbackResult == paAbort )
                    bp->framesInTempOutputBuffer = 0;
                else
                    bp->framesInTempOutputBuffer = bp->framesPerUserBuffer;
            }
            else
            {
                /* paComplete or paAbort has already been called. */

                bp->framesInTempInputBuffer = 0;
            }
        }

        /* copy frames from user (tempOutputBuffer) to host output buffers (hostOutputChannels)
           Means to process the user output provided by the callback. Has to be called after
            each callback. */
        CopyTempOutputBuffersToHostOutputBuffers( bp );

    }

    return framesProcessed;
}